

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesTestsUtil.cpp
# Opt level: O0

deUint32 vkt::sparse::getNumLayers(ImageType imageType,UVec3 *imageSize)

{
  uint uVar1;
  UVec3 *imageSize_local;
  ImageType imageType_local;
  
  switch(imageType) {
  case IMAGE_TYPE_1D:
  case IMAGE_TYPE_2D:
  case IMAGE_TYPE_3D:
  case IMAGE_TYPE_BUFFER:
    imageSize_local._4_4_ = 1;
    break;
  case IMAGE_TYPE_1D_ARRAY:
  case IMAGE_TYPE_2D_ARRAY:
    imageSize_local._4_4_ = tcu::Vector<unsigned_int,_3>::z(imageSize);
    break;
  case IMAGE_TYPE_CUBE:
    imageSize_local._4_4_ = 6;
    break;
  case IMAGE_TYPE_CUBE_ARRAY:
    uVar1 = tcu::Vector<unsigned_int,_3>::z(imageSize);
    imageSize_local._4_4_ = uVar1 * 6;
    break;
  default:
    imageSize_local._4_4_ = 0;
  }
  return imageSize_local._4_4_;
}

Assistant:

deUint32 getNumLayers (const ImageType imageType, const tcu::UVec3& imageSize)
{
	switch (imageType)
	{
	case IMAGE_TYPE_1D:
	case IMAGE_TYPE_2D:
	case IMAGE_TYPE_3D:
	case IMAGE_TYPE_BUFFER:
		return 1u;

	case IMAGE_TYPE_1D_ARRAY:
	case IMAGE_TYPE_2D_ARRAY:
		return imageSize.z();

	case IMAGE_TYPE_CUBE:
		return 6u;

	case IMAGE_TYPE_CUBE_ARRAY:
		return imageSize.z() * 6u;

	default:
		DE_FATAL("Unknown image type");
		return 0u;
	}
}